

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int EmitSampledRGB(VP8Io *io,WebPDecParams *p)

{
  int dst_stride;
  WebPDecBuffer *pWVar1;
  
  pWVar1 = p->output;
  dst_stride = (pWVar1->u).RGBA.stride;
  WebPSamplerProcessPlane
            (io->y,io->y_stride,io->u,io->v,io->uv_stride,
             (pWVar1->u).RGBA.rgba + (long)io->mb_y * (long)dst_stride,dst_stride,io->mb_w,io->mb_h,
             WebPSamplers[pWVar1->colorspace]);
  return io->mb_h;
}

Assistant:

static int EmitSampledRGB(const VP8Io* const io, WebPDecParams* const p) {
  WebPDecBuffer* const output = p->output;
  WebPRGBABuffer* const buf = &output->u.RGBA;
  uint8_t* const dst = buf->rgba + (ptrdiff_t)io->mb_y * buf->stride;
  WebPSamplerProcessPlane(io->y, io->y_stride,
                          io->u, io->v, io->uv_stride,
                          dst, buf->stride, io->mb_w, io->mb_h,
                          WebPSamplers[output->colorspace]);
  return io->mb_h;
}